

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void __thiscall CVmObjTads::change_superclass_list(CVmObjTads *this,vm_val_t *lst,int cnt)

{
  vm_tadsobj_hdr *this_00;
  vm_tadsobj_hdr *pvVar1;
  CVmObject *pCVar2;
  int in_EDX;
  size_t in_RSI;
  vm_tadsobj_hdr *in_RDI;
  CVmObjTads *unaff_retaddr;
  vm_val_t ele;
  int i;
  vm_tadsobj_hdr *hdr;
  int local_48;
  int local_44;
  vm_obj_id_t local_30;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_48 = in_EDX;
  pvVar1 = in_RDI;
  this_00 = get_hdr((CVmObjTads *)in_RDI);
  if (local_48 < 0x10000) {
    if (local_48 < 0) {
      local_48 = 0;
    }
    local_44 = local_48;
  }
  else {
    local_44 = 0xffff;
  }
  if ((int)(uint)this_00->sc_cnt < local_44) {
    pvVar1 = vm_tadsobj_hdr::expand_to
                       (unaff_retaddr,pvVar1,in_RSI,CONCAT44(local_44,in_stack_ffffffffffffffe8));
    *(vm_tadsobj_hdr **)&in_RDI->li_obj_flags = pvVar1;
    this_00 = get_hdr((CVmObjTads *)in_RDI);
  }
  this_00->sc_cnt = (unsigned_short)local_44;
  for (iVar3 = 0; iVar3 < local_44; iVar3 = iVar3 + 1) {
    vm_val_t::ll_index((vm_val_t *)this_00,(vm_val_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                       in_stack_ffffffffffffffd4);
    this_00->sc[iVar3].id = local_30;
    pCVar2 = vm_objp(0);
    this_00->sc[iVar3].objp = (CVmObjTads *)pCVar2;
  }
  vm_tadsobj_hdr::inval_inh_path(in_RDI);
  return;
}

Assistant:

void CVmObjTads::change_superclass_list(VMG_ const vm_val_t *lst, int cnt)
{
    vm_tadsobj_hdr *hdr = get_hdr();
    int i;

    /* keep the count within range */
    cnt = (cnt > UINT16MAXVAL ? UINT16MAXVAL : cnt < 0 ? 0 : cnt);
    
    /* 
     *   if we're increasing the number of superclasses, expand our object
     *   header to make room 
     */
    if (cnt > (int)hdr->sc_cnt)
    {
        /* expand the header to accomodate the new superclass list */
        ext_ = (char *)vm_tadsobj_hdr::expand_to(
            vmg_ this, hdr, cnt, hdr->prop_entry_cnt);

        /* get the new header */
        hdr = get_hdr();
    }

    /* set the new superclass count */
    hdr->sc_cnt = (ushort)cnt;

    /* set the new superclasses */
    for (i = 0 ; i < cnt ; ++i)
    {
        vm_val_t ele;

        /* get this element from the list */
        lst->ll_index(vmg_ &ele, i+1);

        /* set this superclass in the header */
        hdr->sc[i].id = ele.val.obj;
        hdr->sc[i].objp = (CVmObjTads *)vm_objp(vmg_ ele.val.obj);
    }

    /* invalidate the cached inheritance path */
    hdr->inval_inh_path();
}